

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  uint uVar2;
  int iVar3;
  int rc;
  Select *p_local;
  Walker *pWalker_local;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar2 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar2 != 0) {
        return uVar2 & 2;
      }
      iVar3 = sqlite3WalkSelectExpr(pWalker,p);
      if ((iVar3 != 0) || (iVar3 = sqlite3WalkSelectFrom(pWalker,p), iVar3 != 0)) {
        return 2;
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}